

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbAbc.c
# Opt level: O3

Abc_Ntk_t * Abc_NtkOptMfse(Abc_Ntk_t *pNtk,Acb_Par_t *pPars)

{
  Acb_Ntk_t *pNtk_00;
  Abc_Ntk_t *pAVar1;
  
  pNtk_00 = Acb_NtkFromAbc(pNtk);
  Acb_NtkOpt(pNtk_00,pPars);
  pAVar1 = Acb_NtkToAbc(pNtk,pNtk_00);
  Acb_ManFree(pNtk_00->pDesign);
  return pAVar1;
}

Assistant:

Abc_Ntk_t * Abc_NtkOptMfse( Abc_Ntk_t * pNtk, Acb_Par_t * pPars )
{
    extern void Acb_NtkOpt( Acb_Ntk_t * p, Acb_Par_t * pPars );
    Abc_Ntk_t * pNtkNew;
    Acb_Ntk_t * p = Acb_NtkFromAbc( pNtk );
    Acb_NtkOpt( p, pPars );
    pNtkNew = Acb_NtkToAbc( pNtk, p );
    Acb_ManFree( p->pDesign );
    return pNtkNew;
}